

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedForward.h
# Opt level: O1

int kwsys_shared_forward_fullpath(char *self_path,char *in_path,char *result,char *desc)

{
  size_t sVar1;
  char *pcVar2;
  char temp_path [4096];
  char msgbuf [4096];
  char acStack_2028 [4096];
  char local_1028 [4104];
  
  if (*in_path == '/') {
    strcpy(result,in_path);
  }
  else {
    strcpy(acStack_2028,self_path);
    sVar1 = strlen(acStack_2028);
    (acStack_2028 + sVar1)[0] = '/';
    (acStack_2028 + sVar1)[1] = '\0';
    strcat(acStack_2028,in_path);
    pcVar2 = realpath(acStack_2028,result);
    if (desc != (char *)0x0 && pcVar2 == (char *)0x0) {
      kwsys_shared_forward_strerror(local_1028);
      fprintf(_stderr,"Error converting %s \"%s\" to real path: %s\n",desc,acStack_2028,local_1028);
    }
    if (pcVar2 == (char *)0x0) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int kwsys_shared_forward_fullpath(const char* self_path,
                                         const char* in_path,
                                         char* result,
                                         const char* desc)
{
  /* Check the specified path type.  */
  if(in_path[0] == '/')
    {
    /* Already a full path.  */
    strcpy(result, in_path);
    }
#if defined(_WIN32)
  else if(in_path[0] && in_path[1] == ':')
    {
    /* Already a full path.  */
    strcpy(result, in_path);
    }
#endif
  else
    {
    /* Relative to self path.  */
    char temp_path[KWSYS_SHARED_FORWARD_MAXPATH];
    strcpy(temp_path, self_path);
    strcat(temp_path, kwsys_shared_forward_path_slash);
    strcat(temp_path, in_path);
    if(!kwsys_shared_forward_realpath(temp_path, result))
      {
      if(desc)
        {
        char msgbuf[KWSYS_SHARED_FORWARD_MAXPATH];
        kwsys_shared_forward_strerror(msgbuf);
        fprintf(stderr, "Error converting %s \"%s\" to real path: %s\n",
                desc, temp_path, msgbuf);
        }
      return 0;
      }
    }